

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O3

int __thiscall
boost::wrapexcept<boost::xpressive::regex_error>::clone
          (wrapexcept<boost::xpressive::regex_error> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  error_info_container *peVar1;
  char *pcVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)operator_new(0x48);
  *puVar3 = &PTR___cxa_pure_virtual_00193368;
  std::runtime_error::runtime_error
            ((runtime_error *)(puVar3 + 1),&(this->super_regex_error).super_runtime_error);
  puVar3[3] = &PTR___cxa_pure_virtual_001933e0;
  peVar1 = (this->super_regex_error).super_exception.data_.px_;
  puVar3[4] = peVar1;
  if (peVar1 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x18))();
  }
  puVar3[7] = *(undefined8 *)&(this->super_regex_error).super_exception.throw_line_;
  pcVar2 = (this->super_regex_error).super_exception.throw_file_;
  puVar3[5] = (this->super_regex_error).super_exception.throw_function_;
  puVar3[6] = pcVar2;
  *(error_type *)(puVar3 + 8) = (this->super_regex_error).code_;
  *puVar3 = &PTR_clone_001932f0;
  puVar3[1] = &PTR__wrapexcept_00193320;
  puVar3[3] = &PTR__wrapexcept_00193348;
  exception_detail::copy_boost_exception
            ((exception *)(puVar3 + 3),&(this->super_regex_error).super_exception);
  return (int)puVar3;
}

Assistant:

virtual boost::exception_detail::clone_base const * clone() const BOOST_OVERRIDE
    {
        wrapexcept * p = new wrapexcept( *this );
        deleter del = { p };

        boost::exception_detail::copy_boost_exception( p, this );

        del.p_ = BOOST_NULLPTR;
        return p;
    }